

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  ma_uint16 mVar5;
  ma_int16 mVar6;
  uint uVar7;
  long lVar8;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar9;
  ma_int32 diff;
  ma_int32 predictor;
  ma_int32 step;
  ma_uint8 nibble1;
  ma_uint8 nibble0;
  ma_uint8 nibbles [4];
  ma_uint32 iByte;
  ma_uint32 iSample;
  ma_uint8 header_1 [8];
  ma_uint8 header [4];
  ma_uint32 iChannel;
  ma_uint64 totalFramesRead;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  byte local_44 [4];
  uint local_40;
  uint local_3c;
  undefined1 local_38 [2];
  byte local_36;
  byte local_32;
  ma_uint8 local_30 [2];
  byte local_2e;
  uint local_2c;
  ma_uint64 local_28;
  long local_20;
  long local_18;
  undefined8 *local_10;
  
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if ((ulong)local_10[0xf] <= (ulong)local_10[0x13]) {
      return local_28;
    }
    if ((*(int *)(local_10 + 0x31) == 0) && (*(int *)((long)local_10 + 0x134) == 0)) {
      if (*(short *)(local_10 + 0xe) == 1) {
        lVar8 = (*(code *)*local_10)(local_10[3],local_30,4);
        if (lVar8 != 4) {
          return local_28;
        }
        *(uint *)((long)local_10 + 0x134) = *(ushort *)(local_10 + 10) - 4;
        if (0x58 < local_2e) {
          (*(code *)local_10[2])(local_10[3],*(undefined4 *)((long)local_10 + 0x134),1);
          *(undefined4 *)((long)local_10 + 0x134) = 0;
          return local_28;
        }
        mVar5 = ma_dr_wav_bytes_to_u16(local_30);
        *(int *)(local_10 + 0x27) = (int)(short)mVar5;
        if (local_2e < 0x59) {
          local_58 = (uint)local_2e;
        }
        else {
          local_58 = 0x58;
        }
        if ((int)local_58 < 0) {
          local_5c = 0;
        }
        else {
          if (local_2e < 0x59) {
            local_60 = (uint)local_2e;
          }
          else {
            local_60 = 0x58;
          }
          local_5c = local_60;
        }
        *(uint *)(local_10 + 0x28) = local_5c;
        *(undefined4 *)((long)local_10 + 0x184) = *(undefined4 *)(local_10 + 0x27);
        *(undefined4 *)(local_10 + 0x31) = 1;
      }
      else {
        lVar8 = (*(code *)*local_10)(local_10[3],local_38,8);
        if (lVar8 != 8) {
          return local_28;
        }
        *(uint *)((long)local_10 + 0x134) = *(ushort *)(local_10 + 10) - 8;
        if ((0x58 < local_36) || (0x58 < local_32)) {
          (*(code *)local_10[2])(local_10[3],*(undefined4 *)((long)local_10 + 0x134),1);
          *(undefined4 *)((long)local_10 + 0x134) = 0;
          return local_28;
        }
        mVar6 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x1f9289);
        *(int *)(local_10 + 0x27) = (int)mVar6;
        if (local_36 < 0x59) {
          local_64 = (uint)local_36;
        }
        else {
          local_64 = 0x58;
        }
        if ((int)local_64 < 0) {
          local_68 = 0;
        }
        else {
          if (local_36 < 0x59) {
            local_6c = (uint)local_36;
          }
          else {
            local_6c = 0x58;
          }
          local_68 = local_6c;
        }
        *(uint *)(local_10 + 0x28) = local_68;
        mVar6 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x1f9327);
        *(int *)((long)local_10 + 0x13c) = (int)mVar6;
        if (local_32 < 0x59) {
          local_70 = (uint)local_32;
        }
        else {
          local_70 = 0x58;
        }
        if ((int)local_70 < 0) {
          local_74 = 0;
        }
        else {
          if (local_32 < 0x59) {
            local_78 = (uint)local_32;
          }
          else {
            local_78 = 0x58;
          }
          local_74 = local_78;
        }
        *(uint *)((long)local_10 + 0x144) = local_74;
        *(undefined4 *)(local_10 + 0x30) = *(undefined4 *)(local_10 + 0x27);
        *(undefined4 *)((long)local_10 + 0x184) = *(undefined4 *)((long)local_10 + 0x13c);
        *(undefined4 *)(local_10 + 0x31) = 1;
      }
    }
    while( true ) {
      bVar9 = false;
      if ((local_18 != 0) && (bVar9 = false, *(int *)(local_10 + 0x31) != 0)) {
        bVar9 = (ulong)local_10[0x13] < (ulong)local_10[0xf];
      }
      if (!bVar9) break;
      if (local_20 != 0) {
        for (local_3c = 0; local_3c < *(ushort *)(local_10 + 0xe); local_3c = local_3c + 1) {
          *(short *)(local_20 + (ulong)local_3c * 2) =
               (short)*(undefined4 *)
                       ((long)local_10 +
                       ((0x10 - (ulong)(*(int *)(local_10 + 0x31) *
                                       (uint)*(ushort *)(local_10 + 0xe))) + (ulong)local_3c) * 4 +
                       0x148);
        }
        local_20 = local_20 + (long)(int)(uint)*(ushort *)(local_10 + 0xe) * 2;
      }
      local_18 = local_18 + -1;
      local_28 = local_28 + 1;
      local_10[0x13] = local_10[0x13] + 1;
      *(int *)(local_10 + 0x31) = *(int *)(local_10 + 0x31) + -1;
    }
    if (local_18 == 0) {
      return local_28;
    }
    if ((*(int *)(local_10 + 0x31) == 0) && (*(int *)((long)local_10 + 0x134) != 0)) {
      *(undefined4 *)(local_10 + 0x31) = 8;
      for (local_2c = 0; local_2c < *(ushort *)(local_10 + 0xe); local_2c = local_2c + 1) {
        lVar8 = (*(code *)*local_10)(local_10[3],local_44,4);
        if (lVar8 != 4) {
          *(undefined4 *)(local_10 + 0x31) = 0;
          return local_28;
        }
        *(int *)((long)local_10 + 0x134) = *(int *)((long)local_10 + 0x134) + -4;
        for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
          bVar1 = local_44[local_40];
          bVar3 = bVar1 & 0xf;
          uVar7 = (int)(local_44[local_40] & 0xf0) >> 4;
          bVar4 = (byte)uVar7;
          iVar2 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable
                  [*(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140)];
          local_88 = *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x138);
          local_54 = iVar2 >> 3;
          if ((bVar1 & 1) != 0) {
            local_54 = (iVar2 >> 2) + local_54;
          }
          if ((bVar1 & 2) != 0) {
            local_54 = (iVar2 >> 1) + local_54;
          }
          if ((bVar1 & 4) != 0) {
            local_54 = iVar2 + local_54;
          }
          if ((bVar1 & 8) != 0) {
            local_54 = -local_54;
          }
          if (local_88 + local_54 < 0x8000) {
            local_80 = local_88 + local_54;
          }
          else {
            local_80 = 0x7fff;
          }
          if (local_80 < -0x8000) {
            local_84 = -0x8000;
          }
          else {
            if (local_88 + local_54 < 0x8000) {
              local_88 = local_88 + local_54;
            }
            else {
              local_88 = 0x7fff;
            }
            local_84 = local_88;
          }
          *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x138) = local_84;
          if (*(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
              ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar3] < 0x59) {
            local_8c = *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
                       ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar3];
          }
          else {
            local_8c = 0x58;
          }
          if (local_8c < 0) {
            local_90 = 0;
          }
          else {
            if (*(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
                ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar3] < 0x59) {
              local_94 = *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
                         ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar3];
            }
            else {
              local_94 = 0x58;
            }
            local_90 = local_94;
          }
          *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) = local_90;
          *(int *)((long)local_10 +
                  ((0x10 - (ulong)(*(int *)(local_10 + 0x31) * (uint)*(ushort *)(local_10 + 0xe))) +
                   (ulong)(local_40 * 2 * (uint)*(ushort *)(local_10 + 0xe)) + (ulong)local_2c) * 4
                  + 0x148) = local_84;
          iVar2 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable
                  [*(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140)];
          local_a0 = *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x138);
          local_54 = iVar2 >> 3;
          if ((uVar7 & 1) != 0) {
            local_54 = (iVar2 >> 2) + local_54;
          }
          if ((uVar7 & 2) != 0) {
            local_54 = (iVar2 >> 1) + local_54;
          }
          if ((uVar7 & 4) != 0) {
            local_54 = iVar2 + local_54;
          }
          if ((uVar7 & 8) != 0) {
            local_54 = -local_54;
          }
          if (local_a0 + local_54 < 0x8000) {
            local_98 = local_a0 + local_54;
          }
          else {
            local_98 = 0x7fff;
          }
          if (local_98 < -0x8000) {
            local_9c = -0x8000;
          }
          else {
            if (local_a0 + local_54 < 0x8000) {
              local_a0 = local_a0 + local_54;
            }
            else {
              local_a0 = 0x7fff;
            }
            local_9c = local_a0;
          }
          *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x138) = local_9c;
          if (*(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
              ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar4] < 0x59) {
            local_a4 = *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
                       ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar4];
          }
          else {
            local_a4 = 0x58;
          }
          if (local_a4 < 0) {
            local_a8 = 0;
          }
          else {
            if (*(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
                ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar4] < 0x59) {
              local_ac = *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) +
                         ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar4];
            }
            else {
              local_ac = 0x58;
            }
            local_a8 = local_ac;
          }
          *(int *)((long)local_10 + (ulong)local_2c * 4 + 0x140) = local_a8;
          *(int *)((long)local_10 +
                  ((0x10 - (ulong)(*(int *)(local_10 + 0x31) * (uint)*(ushort *)(local_10 + 0xe))) +
                   (ulong)((local_40 * 2 + 1) * (uint)*(ushort *)(local_10 + 0xe)) + (ulong)local_2c
                  ) * 4 + 0x148) = local_9c;
        }
      }
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint32 iChannel;
    static ma_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };
    static ma_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17,
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45,
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118,
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066,
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899,
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767
    };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = (ma_int16)ma_dr_wav_bytes_to_u16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                ma_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable) || header[6] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = ma_dr_wav_bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.predictor[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = ma_dr_wav_clamp(header[6], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->ima.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    ma_uint32 iByte;
                    ma_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;
                    for (iByte = 0; iByte < 4; ++iByte) {
                        ma_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        ma_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);
                        ma_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        ma_int32 predictor = pWav->ima.predictor[iChannel];
                        ma_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;
                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];
                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }
    return totalFramesRead;
}